

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O0

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *
tchecker::ta::delay_allowed
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          system_t *system,reference_clock_variables_t *r,vloc_t *vloc)

{
  reference_clock_variables_t *prVar1;
  bool bVar2;
  capacity_t cVar3;
  clock_id_t cVar4;
  uint *puVar5;
  const_reference pvVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  size_t i;
  allocator<unsigned_long> local_3a;
  undefined1 local_39;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *procmap;
  size_t size;
  vloc_t *vloc_local;
  reference_clock_variables_t *r_local;
  system_t *system_local;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *allowed;
  
  size = (size_t)vloc;
  vloc_local = (vloc_t *)r;
  r_local = (reference_clock_variables_t *)system;
  system_local = (system_t *)__return_storage_ptr__;
  cVar3 = vloc_t::size(vloc);
  procmap = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)cVar3;
  local_38 = reference_clock_variables_t::procmap((reference_clock_variables_t *)vloc_local);
  local_39 = 0;
  cVar4 = reference_clock_variables_t::refcount((reference_clock_variables_t *)vloc_local);
  std::allocator<unsigned_long>::allocator(&local_3a);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (__return_storage_ptr__,(ulong)cVar4,0,&local_3a);
  std::allocator<unsigned_long>::~allocator(&local_3a);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set(__return_storage_ptr__);
  local_58 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  do {
    prVar1 = r_local;
    if (procmap <= local_58) {
      return __return_storage_ptr__;
    }
    puVar5 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::operator[]
                       ((make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)size,
                        (capacity_t)local_58);
    bVar2 = system_t::is_urgent((system_t *)prVar1,*puVar5);
    prVar1 = r_local;
    if (bVar2) {
LAB_002570e9:
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_38,(size_type)local_58);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
                (__return_storage_ptr__,(ulong)*pvVar6);
    }
    else {
      puVar5 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::operator[]
                         ((make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)size,
                          (capacity_t)local_58);
      bVar2 = syncprod::system_t::is_committed((system_t *)prVar1,*puVar5);
      if (bVar2) goto LAB_002570e9;
    }
    local_58 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(local_58->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

boost::dynamic_bitset<> delay_allowed(tchecker::ta::system_t const & system, tchecker::reference_clock_variables_t const & r,
                                      tchecker::vloc_t const & vloc)
{
  std::size_t const size = vloc.size();
  std::vector<tchecker::clock_id_t> const & procmap = r.procmap();
  boost::dynamic_bitset<> allowed{r.refcount()};
  allowed.set();
  for (std::size_t i = 0; i < size; ++i)
    if (system.is_urgent(vloc[i]) || system.is_committed(vloc[i]))
      allowed.reset(procmap[i]);
  return allowed;
}